

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorsmodel.cpp
# Opt level: O1

int __thiscall EditorsModel::emptyRow(EditorsModel *this)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int local_a0;
  int local_9c;
  anon_union_24_3_e3d07ef4_for_data local_98;
  QArrayData *local_78;
  long local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  local_98._forAlignment = -NAN;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  iVar4 = (**(code **)(*(long *)this + 0x78))();
  if (0 < iVar4) {
    local_a0 = 0;
    do {
      local_98._forAlignment = -NAN;
      local_98._8_8_ = 0;
      local_98._16_8_ = 0;
      iVar4 = (**(code **)(*(long *)this + 0x80))(this,&local_98);
      bVar2 = 0 < iVar4;
      if (iVar4 < 1) {
        local_9c = local_a0;
      }
      else {
        iVar4 = 1;
        do {
          local_60 = 0xffffffffffffffff;
          local_58 = 0;
          uStack_50 = 0;
          (**(code **)(*(long *)this + 0x60))(local_48,this,local_a0,iVar4 + -1,&local_60);
          (**(code **)(*(long *)this + 0x90))(&local_98,this,local_48,0);
          QVariant::toString();
          lVar3 = local_68;
          if (local_78 != (QArrayData *)0x0) {
            LOCK();
            (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78,2,8);
            }
          }
          QVariant::~QVariant((QVariant *)&local_98);
          if (lVar3 != 0) goto LAB_0013d437;
          local_98._forAlignment = -NAN;
          local_98._8_8_ = 0;
          local_98._16_8_ = 0;
          iVar5 = (**(code **)(*(long *)this + 0x80))(this,&local_98);
          bVar2 = iVar4 < iVar5;
          bVar1 = iVar4 < iVar5;
          iVar4 = iVar4 + 1;
        } while (bVar1);
        local_9c = local_a0;
      }
LAB_0013d437:
      if (!bVar2) {
        return local_9c;
      }
      local_a0 = local_a0 + 1;
      local_98._forAlignment = -NAN;
      local_98._8_8_ = 0;
      local_98._16_8_ = 0;
      iVar4 = (**(code **)(*(long *)this + 0x78))(this,&local_98);
    } while (local_a0 < iVar4);
  }
  return -1;
}

Assistant:

int EditorsModel::emptyRow() const {
    for(int r=0;r<rowCount();r++) {
        bool empty = true;
        for (int c=0;c<columnCount();c++) {
            if (!data(index(r,c)).toString().isEmpty()) {
                empty = false;
                break;
            }
        }
        if (empty) {
            return r;
        }
    }
    return -1;
}